

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharStringType2Tracer.cpp
# Opt level: O0

EStatusCode __thiscall
CharStringType2Tracer::TraceGlyphProgram
          (CharStringType2Tracer *this,unsigned_short inFontIndex,unsigned_short inGlyphIndex,
          CFFFileInput *inCFFFileInput,IByteWriter *inWriter)

{
  Trace *pTVar1;
  CharString *inCharStringToIntepret;
  CharString *charString;
  EStatusCode local_7c;
  undefined1 local_78 [4];
  EStatusCode status;
  CharStringType2Interpreter interpreter;
  IByteWriter *inWriter_local;
  CFFFileInput *inCFFFileInput_local;
  unsigned_short inGlyphIndex_local;
  unsigned_short inFontIndex_local;
  CharStringType2Tracer *this_local;
  
  interpreter._72_8_ = inWriter;
  CharStringType2Interpreter::CharStringType2Interpreter((CharStringType2Interpreter *)local_78);
  local_7c = CFFFileInput::PrepareForGlyphIntepretation(inCFFFileInput,inFontIndex,inGlyphIndex);
  this->mWriter = (IByteWriter *)interpreter._72_8_;
  this->mHelper = inCFFFileInput;
  PrimitiveObjectsWriter::SetStreamForWriting
            (&this->mPrimitiveWriter,(IByteWriter *)interpreter._72_8_);
  this->mStemsCount = 0;
  if (local_7c == eSuccess) {
    inCharStringToIntepret =
         CFFFileInput::GetGlyphCharString(inCFFFileInput,inFontIndex,inGlyphIndex);
    if (inCharStringToIntepret == (CharString *)0x0) {
      pTVar1 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar1,"CharStringType2Tracer::Trace, Exception, cannot find glyph index");
    }
    else {
      local_7c = CharStringType2Interpreter::Intepret
                           ((CharStringType2Interpreter *)local_78,inCharStringToIntepret,
                            &this->super_IType2InterpreterImplementation);
    }
  }
  else {
    pTVar1 = Trace::DefaultTrace();
    Trace::TraceToLog(pTVar1,
                      "CharStringType2Tracer::Trace, Exception, cannot prepare for glyph interpretation"
                     );
  }
  CharStringType2Interpreter::~CharStringType2Interpreter((CharStringType2Interpreter *)local_78);
  return local_7c;
}

Assistant:

EStatusCode CharStringType2Tracer::TraceGlyphProgram(unsigned short inFontIndex, 
													unsigned short inGlyphIndex, 
													CFFFileInput* inCFFFileInput, 
													IByteWriter* inWriter)
{
	CharStringType2Interpreter interpreter;
	EStatusCode status = inCFFFileInput->PrepareForGlyphIntepretation(inFontIndex,inGlyphIndex);

	mWriter = inWriter;
	mHelper = inCFFFileInput;
	mPrimitiveWriter.SetStreamForWriting(inWriter);
	mStemsCount = 0;

	do
	{
		if(status != eSuccess)
		{
			TRACE_LOG("CharStringType2Tracer::Trace, Exception, cannot prepare for glyph interpretation");
			break;
		}
		
		CharString* charString = inCFFFileInput->GetGlyphCharString(inFontIndex,inGlyphIndex);
		if(!charString)
		{
			TRACE_LOG("CharStringType2Tracer::Trace, Exception, cannot find glyph index");
			break;
		}

		status = interpreter.Intepret(*charString,this);

	}while(false);
	return status;
}